

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_CalculateIssuanceValueTest_Test::TestBody
          (ConfidentialTransaction_CalculateIssuanceValueTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_540;
  Message local_538;
  string local_530;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_8;
  Message local_4f8;
  string local_4f0;
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_7;
  Message local_4b8;
  string local_4b0;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_6;
  Message local_478;
  ByteData256 local_470;
  IssuanceParameter local_458;
  AssertHelper local_3e8;
  Message local_3e0;
  string local_3d8;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_5;
  Message local_3a0;
  string local_398;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_4;
  Message local_360;
  string local_358;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_3;
  Message local_320;
  ByteData256 local_318;
  IssuanceParameter local_300;
  allocator local_289;
  string local_288;
  undefined1 local_268 [8];
  ByteData256 contract_hash;
  Message local_248;
  string local_240;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_2;
  Message local_208;
  string local_200;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_1;
  Message local_1c8;
  string local_1c0;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  Message local_188 [2];
  ByteData256 local_178;
  IssuanceParameter local_160;
  undefined1 local_f0 [8];
  IssuanceParameter param;
  ByteData256 contract_hash_empty;
  uint32_t vout;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Txid txid;
  ConfidentialTransaction_CalculateIssuanceValueTest_Test *this_local;
  
  txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"d1efb621591f94f66a9c3161addd6d7db0ae82cc1674e3b098051793fb70028a",
             &local_51);
  cfd::core::Txid::Txid((Txid *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&param.token.version_);
  cfd::core::IssuanceParameter::IssuanceParameter((IssuanceParameter *)local_f0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData256::ByteData256(&local_178);
      cfd::core::ConfidentialTransaction::CalculateIssuanceValue
                (&local_160,(Txid *)local_30,1,false,(ByteData256 *)&param.token.version_,&local_178
                );
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)local_f0,&local_160);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_160);
      cfd::core::ByteData256::~ByteData256(&local_178);
    }
  }
  else {
    testing::Message::Message(local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5c5,
               "Expected: (param = ConfidentialTransaction::CalculateIssuanceValue( txid, vout, false, contract_hash_empty, ByteData256())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_188);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_1c0,(BlindFactor *)local_f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1a0,"param.entropy.GetHex().c_str()",
             "\"18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c\"",pcVar2,
             "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  std::__cxx11::string::~string((string *)&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5c8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_200,
             (ConfidentialAssetId *)
             ((long)&param.entropy.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1e0,"param.asset.GetHex().c_str()",
             "\"598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07\"",pcVar2,
             "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5cb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_240,(ConfidentialAssetId *)&param.asset.version_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_220,"param.token.GetHex().c_str()",
             "\"4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993\"",pcVar2,
             "4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993");
  std::__cxx11::string::~string((string *)&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &contract_hash.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5ce,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &contract_hash.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_248);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &contract_hash.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_288,"fdf4d615b2b78b61c85ccd5129584dc1b7cbd6c75a1c799cc0738bc783dafd68"
             ,&local_289);
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_268,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData256::ByteData256(&local_318);
      cfd::core::ConfidentialTransaction::CalculateIssuanceValue
                (&local_300,(Txid *)local_30,1,false,(ByteData256 *)local_268,&local_318);
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)local_f0,&local_300);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_300);
      cfd::core::ByteData256::~ByteData256(&local_318);
    }
  }
  else {
    testing::Message::Message(&local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5d7,
               "Expected: (param = ConfidentialTransaction::CalculateIssuanceValue(txid, vout, false, contract_hash, ByteData256())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_320);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_358,(BlindFactor *)local_f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_338,"param.entropy.GetHex().c_str()",
             "\"9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c\"",pcVar2,
             "9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c");
  std::__cxx11::string::~string((string *)&local_358);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5da,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_360);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_398,
             (ConfidentialAssetId *)
             ((long)&param.entropy.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_378,"param.asset.GetHex().c_str()",
             "\"76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303\"",pcVar2,
             "76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303");
  std::__cxx11::string::~string((string *)&local_398);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5dd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_3d8,(ConfidentialAssetId *)&param.asset.version_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3b8,"param.token.GetHex().c_str()",
             "\"e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879\"",pcVar2,
             "e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879");
  std::__cxx11::string::~string((string *)&local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5e0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ByteData256::ByteData256(&local_470);
      cfd::core::ConfidentialTransaction::CalculateIssuanceValue
                (&local_458,(Txid *)local_30,1,true,(ByteData256 *)&param.token.version_,&local_470)
      ;
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)local_f0,&local_458);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_458);
      cfd::core::ByteData256::~ByteData256(&local_470);
    }
  }
  else {
    testing::Message::Message(&local_478);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5e5,
               "Expected: (param = ConfidentialTransaction::CalculateIssuanceValue( txid, vout, true, contract_hash_empty, ByteData256())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_478);
  }
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_4b0,(BlindFactor *)local_f0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_490,"param.entropy.GetHex().c_str()",
             "\"18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c\"",pcVar2,
             "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  std::__cxx11::string::~string((string *)&local_4b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5e8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_4b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_4b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_4f0,
             (ConfidentialAssetId *)
             ((long)&param.entropy.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 0x10));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4d0,"param.asset.GetHex().c_str()",
             "\"598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07\"",pcVar2,
             "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  std::__cxx11::string::~string((string *)&local_4f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5eb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_530,(ConfidentialAssetId *)&param.asset.version_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_510,"param.token.GetHex().c_str()",
             "\"3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610\"",pcVar2,
             "3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610");
  std::__cxx11::string::~string((string *)&local_530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    testing::Message::~Message(&local_538);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_268);
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)local_f0);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)&param.token.version_);
  cfd::core::Txid::~Txid((Txid *)local_30);
  return;
}

Assistant:

TEST(ConfidentialTransaction, CalculateIssuanceValueTest) {
  Txid txid("d1efb621591f94f66a9c3161addd6d7db0ae82cc1674e3b098051793fb70028a");
  uint32_t vout = 1;
  ByteData256 contract_hash_empty;
  IssuanceParameter param;

  // not blind
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(
          txid, vout, false, contract_hash_empty, ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "4dda0f2bc939213feae25a16dcade5f235ab28564d56dc4f7f69d977d441f993");

  // contract hash
  ByteData256 contract_hash(
      "fdf4d615b2b78b61c85ccd5129584dc1b7cbd6c75a1c799cc0738bc783dafd68");
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(txid, vout,
                                                               false,
                                                               contract_hash,
                                                               ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "9ed3d5d8f571d5b6ad03b5d17cee4fec1de36b65f4eb7d84aad264ddf260c09c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "76ab84689c4b03e254c89188962d262d159d21b4f1ccdfaf061d79dd53ddf303");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "e9aab5dcff7203b1dd77d42b727058835eb0034b3fad91e6d2bb69c21d7a5879");

  // blind
  EXPECT_NO_THROW(
      (param = ConfidentialTransaction::CalculateIssuanceValue(
          txid, vout, true, contract_hash_empty, ByteData256())));
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "18dde72422dba6e922b41ae3c23243e64d361a6e18c49b75a0b02e627b1dae0c");
  EXPECT_STREQ(
      param.asset.GetHex().c_str(),
      "598ae0bb5298b89e257b64bcbb05e4f70a2def1c1c74d929ef753021e0559e07");
  EXPECT_STREQ(
      param.token.GetHex().c_str(),
      "3b4a21657d88d5004008ccf00441270a20984228eb06289660b63b475b539610");
}